

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
basisu::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator=(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  pointer pcVar1;
  uint32_t uVar2;
  uint min_new_capacity;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  
  if (this != other) {
    min_new_capacity = other->m_size;
    if (this->m_capacity < min_new_capacity) {
      pbVar6 = this->m_p;
      if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((ulong)this->m_size != 0) {
          lVar4 = (ulong)this->m_size << 5;
          paVar5 = &pbVar6->field_2;
          do {
            if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar5->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                              paVar5->_M_allocated_capacity + 1);
            }
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(&paVar5->_M_allocated_capacity + 4);
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != 0);
          pbVar6 = this->m_p;
        }
        free(pbVar6);
        this->m_p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
        min_new_capacity = other->m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,min_new_capacity,false,0x20,object_mover,false);
    }
    else if ((ulong)this->m_size != 0) {
      lVar4 = (ulong)this->m_size << 5;
      paVar5 = &this->m_p->field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + 4);
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
      this->m_size = 0;
    }
    uVar2 = other->m_size;
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      pbVar6 = other->m_p;
      pbVar3 = this->m_p;
      do {
        (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
        pcVar1 = (pbVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pbVar3,pcVar1,pcVar1 + pbVar6->_M_string_length);
        pbVar6 = pbVar6 + 1;
        uVar2 = uVar2 - 1;
        pbVar3 = pbVar3 + 1;
      } while (uVar2 != 0);
      uVar2 = other->m_size;
    }
    this->m_size = uVar2;
  }
  return this;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }